

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall Image::saveToPPM(Image *this,char *filename)

{
  ostream *poVar1;
  float *pfVar2;
  int iVar3;
  float fVar4;
  ofstream ofs;
  char local_23d;
  int local_23c;
  float local_238;
  float local_234;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P6\n",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,this->width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n255\n",5);
  if (0 < this->height) {
    pfVar2 = this->imageData;
    iVar3 = 0;
    do {
      local_23c = iVar3;
      if (0 < this->width) {
        iVar3 = 0;
        do {
          fVar4 = powf(*pfVar2,0.45454547);
          fVar4 = fVar4 * 255.0 + 0.5;
          if (255.0 <= fVar4) {
            fVar4 = 255.0;
          }
          if (fVar4 <= 0.0) {
            fVar4 = 0.0;
          }
          local_234 = powf(pfVar2[1],0.45454547);
          local_238 = powf(pfVar2[2],0.45454547);
          local_23d = (char)(int)fVar4;
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,&local_23d,1);
          fVar4 = local_234 * 255.0 + 0.5;
          if (255.0 <= fVar4) {
            fVar4 = 255.0;
          }
          if (fVar4 <= 0.0) {
            fVar4 = 0.0;
          }
          local_23d = (char)(int)fVar4;
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_23d,1);
          fVar4 = local_238 * 255.0 + 0.5;
          if (255.0 <= fVar4) {
            fVar4 = 255.0;
          }
          if (fVar4 <= 0.0) {
            fVar4 = 0.0;
          }
          local_23d = (char)(int)fVar4;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_23d,1);
          pfVar2 = pfVar2 + 3;
          iVar3 = iVar3 + 1;
        } while (iVar3 < this->width);
      }
      iVar3 = local_23c + 1;
    } while (iVar3 < this->height);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sinf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Image::saveToPPM(const char *filename) {
    std::ofstream ofs;
        ofs.open(filename);
        ofs << "P6\n" << width << " " << height << "\n255\n";
        float *pixel = imageData;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                unsigned char r = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[0], 1/2.2) * 255 + 0.5f)));
                unsigned char g = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[1], 1/2.2) * 255 + 0.5f)));
                unsigned char b = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[2], 1/2.2) * 255 + 0.5f)));
                ofs << r << g << b;
                pixel += 3;
            }
        }
        ofs.close();
}